

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_read_certificate_request(SSL_HANDSHAKE *hs)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  pointer psVar3;
  size_t sVar4;
  stack_st_CRYPTO_BUFFER *__p;
  undefined1 in_R9B;
  initializer_list<bssl::SSLExtension_*> extensions_00;
  byte local_e9;
  unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_e8;
  size_t *local_e0;
  size_t *local_d8;
  size_t **local_d0;
  undefined8 local_c8;
  undefined1 local_b9 [8];
  uint8_t alert;
  CBS supported_signature_algorithms;
  CBS extensions;
  CBS context;
  CBS body;
  SSLExtension ca;
  SSLExtension sigalgs;
  SSLMessage msg;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if ((*(ushort *)&ssl_00->s3->field_0xdc >> 5 & 1) == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->pake_prover);
    if (bVar1) {
      hs->tls13_state = 8;
      hs_local._4_4_ = ssl_hs_ok;
    }
    else {
      bVar1 = (*ssl_00->method->get_message)(ssl_00,(SSLMessage *)&sigalgs.data.len);
      if (bVar1) {
        if (sigalgs.data.len._1_1_ == '\r') {
          SSLExtension::SSLExtension((SSLExtension *)&ca.data.len,0xd,true);
          SSLExtension::SSLExtension((SSLExtension *)&body.len,0x2f,true);
          local_b9[0] = 0x32;
          iVar2 = CBS_get_u8_length_prefixed((CBS *)&context.len,(CBS *)&extensions.len);
          local_e9 = 1;
          if (iVar2 != 0) {
            sVar4 = CBS_len((CBS *)&extensions.len);
            local_e9 = 1;
            if (sVar4 == 0) {
              iVar2 = CBS_get_u16_length_prefixed
                                ((CBS *)&context.len,(CBS *)&supported_signature_algorithms.len);
              local_e9 = 1;
              if (iVar2 != 0) {
                sVar4 = CBS_len((CBS *)&context.len);
                local_e9 = 1;
                if (sVar4 == 0) {
                  local_e0 = &ca.data.len;
                  local_d8 = &body.len;
                  local_d0 = &local_e0;
                  local_c8 = 2;
                  extensions_00._M_len = 1;
                  extensions_00._M_array = (iterator)0x2;
                  bVar1 = ssl_parse_extensions
                                    ((bssl *)&supported_signature_algorithms.len,(CBS *)local_b9,
                                     (uint8_t *)local_d0,extensions_00,(bool)in_R9B);
                  local_e9 = 1;
                  if ((bVar1) && (local_e9 = 1, (ca.data.len._3_1_ & 1) != 0)) {
                    iVar2 = CBS_get_u16_length_prefixed((CBS *)&sigalgs,(CBS *)(local_b9 + 1));
                    local_e9 = 1;
                    if (iVar2 != 0) {
                      bVar1 = tls1_parse_peer_sigalgs(hs,(CBS *)(local_b9 + 1));
                      local_e9 = bVar1 ^ 0xff;
                    }
                  }
                }
              }
            }
          }
          if ((local_e9 & 1) == 0) {
            if ((body.len._3_1_ & 1) == 0) {
              __p = sk_CRYPTO_BUFFER_new_null();
              std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                        (&hs->ca_names,__p);
              bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->ca_names);
              if (!bVar1) {
                ssl_send_alert(ssl_00,2,0x50);
                return ssl_hs_error;
              }
            }
            else {
              SSL_parse_CA_list((bssl *)&local_e8,ssl_00,local_b9,(CBS *)&ca);
              std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::operator=
                        (&hs->ca_names,&local_e8);
              std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                        (&local_e8);
              bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->ca_names);
              if (!bVar1) {
                ssl_send_alert(ssl_00,2,(uint)local_b9[0]);
                return ssl_hs_error;
              }
            }
            *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xffffffdf | 0x20;
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
            (*psVar3->x509_method->hs_flush_cached_ca_names)(hs);
            bVar1 = ssl_hash_message(hs,(SSLMessage *)&sigalgs.data.len);
            if (bVar1) {
              (*ssl_00->method->next_message)(ssl_00);
              hs->tls13_state = 5;
              hs_local._4_4_ = ssl_hs_ok;
            }
            else {
              hs_local._4_4_ = ssl_hs_error;
            }
          }
          else {
            ssl_send_alert(ssl_00,2,(uint)local_b9[0]);
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                          ,0x2ce);
            hs_local._4_4_ = ssl_hs_error;
          }
        }
        else {
          hs->tls13_state = 5;
          hs_local._4_4_ = ssl_hs_ok;
        }
      }
      else {
        hs_local._4_4_ = ssl_hs_read_message;
      }
    }
  }
  else {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx);
    if (((psVar3->reverify_on_resume & 1U) == 0) ||
       ((*(ushort *)&ssl_00->s3->field_0xdc >> 9 & 1) != 0)) {
      hs->tls13_state = 8;
      hs_local._4_4_ = ssl_hs_ok;
    }
    else {
      hs->tls13_state = 7;
      hs_local._4_4_ = ssl_hs_ok;
    }
  }
  return hs_local._4_4_;
}

Assistant:

static enum ssl_hs_wait_t do_read_certificate_request(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;

  if (!ssl_cipher_uses_certificate_auth(hs->new_cipher)) {
    hs->state = state_read_server_hello_done;
    return ssl_hs_ok;
  }

  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (msg.type == SSL3_MT_SERVER_HELLO_DONE) {
    // If we get here we don't need the handshake buffer as we won't be doing
    // client auth.
    hs->transcript.FreeBuffer();
    hs->state = state_read_server_hello_done;
    return ssl_hs_ok;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_CERTIFICATE_REQUEST) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  // Get the certificate types.
  CBS body = msg.body, certificate_types;
  if (!CBS_get_u8_length_prefixed(&body, &certificate_types)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return ssl_hs_error;
  }

  if (!hs->certificate_types.CopyFrom(certificate_types)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_hs_error;
  }

  if (ssl_protocol_version(ssl) >= TLS1_2_VERSION) {
    CBS supported_signature_algorithms;
    if (!CBS_get_u16_length_prefixed(&body, &supported_signature_algorithms) ||
        !tls1_parse_peer_sigalgs(hs, &supported_signature_algorithms)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return ssl_hs_error;
    }
  }

  uint8_t alert = SSL_AD_DECODE_ERROR;
  UniquePtr<STACK_OF(CRYPTO_BUFFER)> ca_names =
      SSL_parse_CA_list(ssl, &alert, &body);
  if (!ca_names) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return ssl_hs_error;
  }

  if (CBS_len(&body) != 0) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return ssl_hs_error;
  }

  hs->cert_request = true;
  hs->ca_names = std::move(ca_names);
  ssl->ctx->x509_method->hs_flush_cached_ca_names(hs);

  ssl->method->next_message(ssl);
  hs->state = state_read_server_hello_done;
  return ssl_hs_ok;
}